

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

void __thiscall ODDLParser::Value::dump(Value *this,IOStreamBase *param_1)

{
  bool bVar1;
  int8 iVar2;
  int16 iVar3;
  int32 iVar4;
  int64 iVar5;
  void *pvVar6;
  char *pcVar7;
  ostream *poVar8;
  float fVar9;
  double dVar10;
  IOStreamBase *param_1_local;
  Value *this_local;
  
  switch(this->m_type) {
  case ddl_bool:
    bVar1 = getBool(this);
    pvVar6 = (void *)std::ostream::operator<<(&std::cout,bVar1);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    break;
  case ddl_int8:
    iVar2 = getInt8(this);
    poVar8 = std::operator<<(&std::cout,(int)iVar2);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    break;
  case ddl_int16:
    iVar3 = getInt16(this);
    pvVar6 = (void *)std::ostream::operator<<(&std::cout,iVar3);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    break;
  case ddl_int32:
    iVar4 = getInt32(this);
    pvVar6 = (void *)std::ostream::operator<<(&std::cout,iVar4);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    break;
  case ddl_int64:
    iVar5 = getInt64(this);
    pvVar6 = (void *)std::ostream::operator<<(&std::cout,iVar5);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    break;
  case ddl_unsigned_int8:
    poVar8 = std::operator<<((ostream *)&std::cout,"Not supported");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    break;
  case ddl_unsigned_int16:
    poVar8 = std::operator<<((ostream *)&std::cout,"Not supported");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    break;
  case ddl_unsigned_int32:
    poVar8 = std::operator<<((ostream *)&std::cout,"Not supported");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    break;
  case ddl_unsigned_int64:
    poVar8 = std::operator<<((ostream *)&std::cout,"Not supported");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    break;
  case ddl_half:
    poVar8 = std::operator<<((ostream *)&std::cout,"Not supported");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    break;
  case ddl_float:
    fVar9 = getFloat(this);
    pvVar6 = (void *)std::ostream::operator<<(&std::cout,fVar9);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    break;
  case ddl_double:
    dVar10 = getDouble(this);
    pvVar6 = (void *)std::ostream::operator<<(&std::cout,dVar10);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    break;
  case ddl_string:
    pcVar7 = getString(this);
    poVar8 = std::operator<<((ostream *)&std::cout,pcVar7);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    break;
  case ddl_ref:
    poVar8 = std::operator<<((ostream *)&std::cout,"Not supported");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    break;
  case ddl_none:
    poVar8 = std::operator<<((ostream *)&std::cout,"None");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Value::dump( IOStreamBase &/*stream*/ ) {
    switch( m_type ) {
        case ddl_none:
            std::cout << "None" << std::endl;
            break;
        case ddl_bool:
            std::cout << getBool() << std::endl;
            break;
        case ddl_int8:
            std::cout << getInt8() << std::endl;
            break;
        case ddl_int16:
            std::cout << getInt16() << std::endl;
            break;
        case ddl_int32:
            std::cout << getInt32() << std::endl;
            break;
        case ddl_int64:
            std::cout << getInt64() << std::endl;
            break;
        case ddl_unsigned_int8:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_unsigned_int16:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_unsigned_int32:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_unsigned_int64:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_half:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_float:
            std::cout << getFloat() << std::endl;
            break;
        case ddl_double:
            std::cout << getDouble() << std::endl;
            break;
        case ddl_string:
            std::cout << getString() << std::endl;
            break;
        case ddl_ref:
            std::cout << "Not supported" << std::endl;
            break;
        default:
            break;
    }
}